

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O2

int CheckFromArray(void)

{
  char *__s;
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char buf2 [128];
  char buf1 [128];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar2 = 0xffffffff;
    goto LAB_0010356b;
  }
  buf1[0x70] = '\0';
  buf1[0x71] = '\0';
  buf1[0x72] = '\0';
  buf1[0x73] = '\0';
  buf1[0x74] = '\0';
  buf1[0x75] = '\0';
  buf1[0x76] = '\0';
  buf1[0x77] = '\0';
  buf1[0x78] = '\0';
  buf1[0x79] = '\0';
  buf1[0x7a] = '\0';
  buf1[0x7b] = '\0';
  buf1[0x7c] = '\0';
  buf1[0x7d] = '\0';
  buf1[0x7e] = '\0';
  buf1[0x7f] = '\0';
  buf1[0x60] = '\0';
  buf1[0x61] = '\0';
  buf1[0x62] = '\0';
  buf1[99] = '\0';
  buf1[100] = '\0';
  buf1[0x65] = '\0';
  buf1[0x66] = '\0';
  buf1[0x67] = '\0';
  buf1[0x68] = '\0';
  buf1[0x69] = '\0';
  buf1[0x6a] = '\0';
  buf1[0x6b] = '\0';
  buf1[0x6c] = '\0';
  buf1[0x6d] = '\0';
  buf1[0x6e] = '\0';
  buf1[0x6f] = '\0';
  buf1[0x50] = '\0';
  buf1[0x51] = '\0';
  buf1[0x52] = '\0';
  buf1[0x53] = '\0';
  buf1[0x54] = '\0';
  buf1[0x55] = '\0';
  buf1[0x56] = '\0';
  buf1[0x57] = '\0';
  buf1[0x58] = '\0';
  buf1[0x59] = '\0';
  buf1[0x5a] = '\0';
  buf1[0x5b] = '\0';
  buf1[0x5c] = '\0';
  buf1[0x5d] = '\0';
  buf1[0x5e] = '\0';
  buf1[0x5f] = '\0';
  buf1[0x40] = '\0';
  buf1[0x41] = '\0';
  buf1[0x42] = '\0';
  buf1[0x43] = '\0';
  buf1[0x44] = '\0';
  buf1[0x45] = '\0';
  buf1[0x46] = '\0';
  buf1[0x47] = '\0';
  buf1[0x48] = '\0';
  buf1[0x49] = '\0';
  buf1[0x4a] = '\0';
  buf1[0x4b] = '\0';
  buf1[0x4c] = '\0';
  buf1[0x4d] = '\0';
  buf1[0x4e] = '\0';
  buf1[0x4f] = '\0';
  buf1[0x30] = '\0';
  buf1[0x31] = '\0';
  buf1[0x32] = '\0';
  buf1[0x33] = '\0';
  buf1[0x34] = '\0';
  buf1[0x35] = '\0';
  buf1[0x36] = '\0';
  buf1[0x37] = '\0';
  buf1[0x38] = '\0';
  buf1[0x39] = '\0';
  buf1[0x3a] = '\0';
  buf1[0x3b] = '\0';
  buf1[0x3c] = '\0';
  buf1[0x3d] = '\0';
  buf1[0x3e] = '\0';
  buf1[0x3f] = '\0';
  buf1[0x20] = '\0';
  buf1[0x21] = '\0';
  buf1[0x22] = '\0';
  buf1[0x23] = '\0';
  buf1[0x24] = '\0';
  buf1[0x25] = '\0';
  buf1[0x26] = '\0';
  buf1[0x27] = '\0';
  buf1[0x28] = '\0';
  buf1[0x29] = '\0';
  buf1[0x2a] = '\0';
  buf1[0x2b] = '\0';
  buf1[0x2c] = '\0';
  buf1[0x2d] = '\0';
  buf1[0x2e] = '\0';
  buf1[0x2f] = '\0';
  buf1[0x10] = '\0';
  buf1[0x11] = '\0';
  buf1[0x12] = '\0';
  buf1[0x13] = '\0';
  buf1[0x14] = '\0';
  buf1[0x15] = '\0';
  buf1[0x16] = '\0';
  buf1[0x17] = '\0';
  buf1[0x18] = '\0';
  buf1[0x19] = '\0';
  buf1[0x1a] = '\0';
  buf1[0x1b] = '\0';
  buf1[0x1c] = '\0';
  buf1[0x1d] = '\0';
  buf1[0x1e] = '\0';
  buf1[0x1f] = '\0';
  buf1[0] = '\0';
  buf1[1] = '\0';
  buf1[2] = '\0';
  buf1[3] = '\0';
  buf1[4] = '\0';
  buf1[5] = '\0';
  buf1[6] = '\0';
  buf1[7] = '\0';
  buf1[8] = '\0';
  buf1[9] = '\0';
  buf1[10] = '\0';
  buf1[0xb] = '\0';
  buf1[0xc] = '\0';
  buf1[0xd] = '\0';
  buf1[0xe] = '\0';
  buf1[0xf] = '\0';
  pcVar3 = ScanChars((FILE *)__stream,0x80,buf1);
  if (pcVar3 == "PASSED") {
    uVar5 = (ulong)testN;
    pcVar3 = testInOut[uVar5].out1;
    sVar4 = strlen(pcVar3);
    iVar1 = strncasecmp(pcVar3,buf1,sVar4);
    pcVar3 = "FAILED";
    if (iVar1 == 0) {
      if ((0x21fUL >> (uVar5 & 0x3f) & 1) == 0) {
        buf2[0x70] = '\0';
        buf2[0x71] = '\0';
        buf2[0x72] = '\0';
        buf2[0x73] = '\0';
        buf2[0x74] = '\0';
        buf2[0x75] = '\0';
        buf2[0x76] = '\0';
        buf2[0x77] = '\0';
        buf2[0x78] = '\0';
        buf2[0x79] = '\0';
        buf2[0x7a] = '\0';
        buf2[0x7b] = '\0';
        buf2[0x7c] = '\0';
        buf2[0x7d] = '\0';
        buf2[0x7e] = '\0';
        buf2[0x7f] = '\0';
        buf2[0x60] = '\0';
        buf2[0x61] = '\0';
        buf2[0x62] = '\0';
        buf2[99] = '\0';
        buf2[100] = '\0';
        buf2[0x65] = '\0';
        buf2[0x66] = '\0';
        buf2[0x67] = '\0';
        buf2[0x68] = '\0';
        buf2[0x69] = '\0';
        buf2[0x6a] = '\0';
        buf2[0x6b] = '\0';
        buf2[0x6c] = '\0';
        buf2[0x6d] = '\0';
        buf2[0x6e] = '\0';
        buf2[0x6f] = '\0';
        buf2[0x50] = '\0';
        buf2[0x51] = '\0';
        buf2[0x52] = '\0';
        buf2[0x53] = '\0';
        buf2[0x54] = '\0';
        buf2[0x55] = '\0';
        buf2[0x56] = '\0';
        buf2[0x57] = '\0';
        buf2[0x58] = '\0';
        buf2[0x59] = '\0';
        buf2[0x5a] = '\0';
        buf2[0x5b] = '\0';
        buf2[0x5c] = '\0';
        buf2[0x5d] = '\0';
        buf2[0x5e] = '\0';
        buf2[0x5f] = '\0';
        buf2[0x40] = '\0';
        buf2[0x41] = '\0';
        buf2[0x42] = '\0';
        buf2[0x43] = '\0';
        buf2[0x44] = '\0';
        buf2[0x45] = '\0';
        buf2[0x46] = '\0';
        buf2[0x47] = '\0';
        buf2[0x48] = '\0';
        buf2[0x49] = '\0';
        buf2[0x4a] = '\0';
        buf2[0x4b] = '\0';
        buf2[0x4c] = '\0';
        buf2[0x4d] = '\0';
        buf2[0x4e] = '\0';
        buf2[0x4f] = '\0';
        buf2[0x30] = '\0';
        buf2[0x31] = '\0';
        buf2[0x32] = '\0';
        buf2[0x33] = '\0';
        buf2[0x34] = '\0';
        buf2[0x35] = '\0';
        buf2[0x36] = '\0';
        buf2[0x37] = '\0';
        buf2[0x38] = '\0';
        buf2[0x39] = '\0';
        buf2[0x3a] = '\0';
        buf2[0x3b] = '\0';
        buf2[0x3c] = '\0';
        buf2[0x3d] = '\0';
        buf2[0x3e] = '\0';
        buf2[0x3f] = '\0';
        buf2[0x20] = '\0';
        buf2[0x21] = '\0';
        buf2[0x22] = '\0';
        buf2[0x23] = '\0';
        buf2[0x24] = '\0';
        buf2[0x25] = '\0';
        buf2[0x26] = '\0';
        buf2[0x27] = '\0';
        buf2[0x28] = '\0';
        buf2[0x29] = '\0';
        buf2[0x2a] = '\0';
        buf2[0x2b] = '\0';
        buf2[0x2c] = '\0';
        buf2[0x2d] = '\0';
        buf2[0x2e] = '\0';
        buf2[0x2f] = '\0';
        buf2[0x10] = '\0';
        buf2[0x11] = '\0';
        buf2[0x12] = '\0';
        buf2[0x13] = '\0';
        buf2[0x14] = '\0';
        buf2[0x15] = '\0';
        buf2[0x16] = '\0';
        buf2[0x17] = '\0';
        buf2[0x18] = '\0';
        buf2[0x19] = '\0';
        buf2[0x1a] = '\0';
        buf2[0x1b] = '\0';
        buf2[0x1c] = '\0';
        buf2[0x1d] = '\0';
        buf2[0x1e] = '\0';
        buf2[0x1f] = '\0';
        buf2[0] = '\0';
        buf2[1] = '\0';
        buf2[2] = '\0';
        buf2[3] = '\0';
        buf2[4] = '\0';
        buf2[5] = '\0';
        buf2[6] = '\0';
        buf2[7] = '\0';
        buf2[8] = '\0';
        buf2[9] = '\0';
        buf2[10] = '\0';
        buf2[0xb] = '\0';
        buf2[0xc] = '\0';
        buf2[0xd] = '\0';
        buf2[0xe] = '\0';
        buf2[0xf] = '\0';
        pcVar3 = ScanChars((FILE *)__stream,0x80,buf2);
        if (pcVar3 == "PASSED") {
          lVar6 = (long)testN;
          pcVar3 = testInOut[lVar6].out2;
          sVar4 = strlen(pcVar3);
          iVar1 = strncasecmp(pcVar3,buf2,sVar4);
          pcVar3 = "PASSED";
          if (iVar1 != 0) {
            __s = testInOut[lVar6].out20;
            if (__s != (char *)0x0) {
              sVar4 = strlen(__s);
              iVar1 = strncasecmp(__s,buf2,sVar4);
              if (iVar1 == 0) goto LAB_0010350d;
            }
            printf("wrong output -- ");
            pcVar3 = "FAILED";
          }
        }
        goto LAB_0010350d;
      }
    }
    else {
LAB_0010350d:
      if (pcVar3 != "PASSED") goto LAB_00103549;
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    if (iVar1 == 0) {
      pcVar3 = "PASSED";
    }
    else {
      pcVar3 = "FAILED";
    }
  }
LAB_00103549:
  fclose(__stream);
  puts(pcVar3);
  uVar2 = (uint)(pcVar3 == "FAILED");
LAB_0010356b:
  testN = testN + 1;
  return uVar2;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    const char* fact = Pass;
    char buf1[128] = {0};
    fact = ScanChars(out, sizeof(buf1), buf1);
    if (fact == Pass && _strnicmp(testInOut[testN].out1, buf1, strlen(testInOut[testN].out1)) != 0) {
        fact = Fail;
    }
    if (fact == Pass && testInOut[testN].out2 != NULL) { // check path
        char buf2[128] = {0};
        fact = ScanChars(out, sizeof(buf2), buf2);
        if (fact == Pass && _strnicmp(testInOut[testN].out2, buf2, strlen(testInOut[testN].out2)) != 0) {
            if (testInOut[testN].out20 == NULL || _strnicmp(testInOut[testN].out20, buf2, strlen(testInOut[testN].out20)) != 0) {
                printf("wrong output -- ");
                fact = Fail;
            }
        }
    }
    if (fact == Pass && HaveGarbageAtTheEnd(out)) {
        fact = Fail;
    }
    fclose(out);
    printf("%s\n", fact);
    testN++;
    return fact == Fail;
}